

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O1

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::denoise
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  undefined1 *__src;
  ParameterSet *this_00;
  DataManager *pDVar1;
  bool bVar2;
  undefined1 local_290 [8];
  TriMesh mesh;
  undefined1 local_58 [16];
  undefined1 auStack_48 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  filtered_normals;
  int local_24 [2];
  int vertex_iteration_number;
  
  DataManager::getNoisyMesh((TriMesh *)local_290,(this->super_MeshDenoisingBase).data_manager_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    auStack_48 = (undefined1  [8])0x0;
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*(this->super_MeshDenoisingBase)._vptr_MeshDenoisingBase[2])(this,local_290);
    this_00 = (this->super_MeshDenoisingBase).parameter_set_;
    mesh.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
    _544_8_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_fcolors_,"Vertex Iteration Num.","");
    bVar2 = ParameterSet::getValue
                      (this_00,(string *)
                               &mesh.super_Mesh.
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                .refcount_fcolors_,local_24);
    if ((undefined1 *)
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        _544_8_ != local_58) {
      operator_delete((void *)mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._544_8_);
    }
    if (bVar2) {
      MeshDenoisingBase::updateVertexPosition
                (&this->super_MeshDenoisingBase,(TriMesh *)local_290,
                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  *)auStack_48,local_24[0],true);
      pDVar1 = (this->super_MeshDenoisingBase).data_manager_;
      OpenMesh::PolyConnectivity::operator=
                ((PolyConnectivity *)&pDVar1->mesh_,(PolyConnectivity *)local_290);
      __src = &mesh.super_Mesh.
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .field_0x19c;
      memcpy(&(pDVar1->mesh_).super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .points_,__src,0x84);
      pDVar1 = (this->super_MeshDenoisingBase).data_manager_;
      OpenMesh::PolyConnectivity::operator=
                ((PolyConnectivity *)&pDVar1->denoised_mesh_,(PolyConnectivity *)local_290);
      memcpy(&(pDVar1->denoised_mesh_).super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .points_,__src,0x84);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48);
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_290);
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // update face normal
    std::vector<TriMesh::Normal> filtered_normals;
    updateFilteredNormals(mesh, filtered_normals);

    // get parameter for vertex update
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    // update vertex position
    updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, true);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}